

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O1

uint32_t lyd_list_pos(lyd_node *instance)

{
  lysc_node *plVar1;
  uint32_t uVar2;
  
  uVar2 = 0;
  if (((instance != (lyd_node *)0x0) &&
      (plVar1 = instance->schema, uVar2 = 0, (plVar1->nodetype & 0x18) != 0)) &&
     (instance->schema == plVar1)) {
    uVar2 = 0;
    do {
      if ((uVar2 != 0) && (instance->next == (lyd_node *)0x0)) {
        return uVar2;
      }
      uVar2 = uVar2 + 1;
      instance = instance->prev;
    } while (instance->schema == plVar1);
  }
  return uVar2;
}

Assistant:

LIBYANG_API_DEF uint32_t
lyd_list_pos(const struct lyd_node *instance)
{
    const struct lyd_node *iter = NULL;
    uint32_t pos = 0;

    if (!instance || !(instance->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))) {
        return 0;
    }

    /* data instances are ordered, so we can stop when we found instance of other schema node */
    for (iter = instance; iter->schema == instance->schema; iter = iter->prev) {
        if (pos && (iter->next == NULL)) {
            /* overrun to the end of the siblings list */
            break;
        }
        ++pos;
    }

    return pos;
}